

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

stumpless_target * open_network_target(stumpless_target *target)

{
  stumpless_target *psVar1;
  
  psVar1 = (stumpless_target *)open_private_network_target((network_target *)target->id);
  if (psVar1 != (stumpless_target *)0x0) {
    psVar1 = target;
  }
  return psVar1;
}

Assistant:

struct stumpless_target *
open_network_target( struct stumpless_target *target ) {
  const struct network_target *result;

  result = open_private_network_target( target->id );
  if( result ) {
    return target;

  } else {
    return NULL;

  }
}